

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UnicodeString::doLastIndexOf(UnicodeString *this,UChar c,int32_t start,int32_t length)

{
  UBool UVar1;
  char16_t *pcVar2;
  UChar *pUVar3;
  UChar *match;
  UChar *array;
  int32_t local_20;
  int32_t length_local;
  int32_t start_local;
  UChar c_local;
  UnicodeString *this_local;
  
  array._4_4_ = length;
  local_20 = start;
  length_local._2_2_ = c;
  _start_local = this;
  UVar1 = isBogus(this);
  if (UVar1 == '\0') {
    pinIndices(this,&local_20,(int32_t *)((long)&array + 4));
    pcVar2 = getArrayStart(this);
    pUVar3 = u_memrchr_63(pcVar2 + local_20,length_local._2_2_,array._4_4_);
    if (pUVar3 == (UChar *)0x0) {
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = (int32_t)((long)pUVar3 - (long)pcVar2 >> 1);
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
UnicodeString::doLastIndexOf(UChar c,
                 int32_t start,
                 int32_t length) const
{
  if(isBogus()) {
    return -1;
  }

  // pin indices
  pinIndices(start, length);

  // find the last occurrence of c
  const UChar *array = getArrayStart();
  const UChar *match = u_memrchr(array + start, c, length);
  if(match == NULL) {
    return -1;
  } else {
    return (int32_t)(match - array);
  }
}